

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glist.c
# Opt level: O3

gnode_t * glist_insert_uint32(gnode_t *gn,uint32 val)

{
  anytype_t aVar1;
  gnode_t *pgVar2;
  
  aVar1.i._4_4_ = 0;
  aVar1.ui._0_4_ = val;
  pgVar2 = (gnode_t *)
           __ckd_calloc__(1,0x10,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/glist.c"
                          ,0xdb);
  pgVar2->data = aVar1;
  pgVar2->next = gn->next;
  gn->next = pgVar2;
  return pgVar2;
}

Assistant:

gnode_t *
glist_insert_uint32(gnode_t * gn, uint32 val)
{
    gnode_t *newgn;

    newgn = (gnode_t *) ckd_calloc(1, sizeof(gnode_t));
    newgn->data.ui = val;
    newgn->next = gn->next;

    gn->next = newgn;

    return newgn;
}